

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdWin.c
# Opt level: O3

word Sbd_ManSolverSupp(Vec_Int_t *vSop,int *pInds,int *pnVars)

{
  int *piVar1;
  word wVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  
  iVar4 = vSop->nSize;
  if (iVar4 < 1) {
    wVar2 = 0;
    iVar6 = 0;
  }
  else {
    piVar1 = vSop->pArray;
    lVar5 = 0;
    iVar6 = 0;
    wVar2 = 0;
    do {
      uVar3 = piVar1[lVar5];
      if (uVar3 != 0xffffffff) {
        if ((int)uVar3 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        if (0x7f < uVar3) {
          __assert_fail("Abc_Lit2Var(Entry) < 64",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdWin.c"
                        ,0x14f,"word Sbd_ManSolverSupp(Vec_Int_t *, int *, int *)");
        }
        uVar3 = uVar3 >> 1;
        if ((wVar2 >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
          pInds[uVar3] = iVar6;
          iVar6 = iVar6 + 1;
          wVar2 = wVar2 | 1L << ((byte)uVar3 & 0x3f);
          iVar4 = vSop->nSize;
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar4);
  }
  *pnVars = iVar6;
  return wVar2;
}

Assistant:

word Sbd_ManSolverSupp( Vec_Int_t * vSop, int * pInds, int * pnVars )
{
    word Supp = 0;
    int i, Entry, nVars = 0;
    Vec_IntForEachEntry( vSop, Entry, i )
    {
        if ( Entry == -1 )
            continue;
        assert( Abc_Lit2Var(Entry) < 64 );
        if ( (Supp >> Abc_Lit2Var(Entry)) & 1 )
            continue;
        pInds[Abc_Lit2Var(Entry)] = nVars++;
        Supp |= (word)1 << Abc_Lit2Var(Entry);
    }
    *pnVars = nVars;
    return Supp;
}